

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memcache.c
# Opt level: O0

byte_req_pair memcache_ascii_consume_response(application_protocol *proto,iovec *resp)

{
  void *pvVar1;
  byte_req_pair bVar2;
  int iVar3;
  char *pcVar4;
  char *ptr;
  char *buf;
  int get_rep_size;
  int bytes_to_process;
  iovec *resp_local;
  application_protocol *proto_local;
  byte_req_pair res;
  
  proto_local = (application_protocol *)0x0;
  res.bytes = 0;
  buf._4_4_ = (int)resp->iov_len;
  pvVar1 = resp->iov_base;
  while ((buf._4_4_ != 0 && (4 < buf._4_4_))) {
    iVar3 = strncmp((char *)((long)pvVar1 + (resp->iov_len - (long)buf._4_4_)),"END\r\n",5);
    if (iVar3 == 0) {
      proto_local = (application_protocol *)&proto_local->field_0x5;
      res.bytes = res.bytes + 1;
      buf._4_4_ = buf._4_4_ + -5;
    }
    else {
      if (buf._4_4_ < 8) break;
      iVar3 = strncmp((char *)((long)pvVar1 + (resp->iov_len - (long)buf._4_4_)),"STORED\r\n",8);
      if (iVar3 == 0) {
        proto_local = (application_protocol *)&proto_local->arg;
        res.bytes = res.bytes + 1;
        buf._4_4_ = buf._4_4_ + -8;
      }
      else {
        pcVar4 = strchnth((char *)((long)pvVar1 + (resp->iov_len - (long)buf._4_4_)),'\n',3);
        if (pcVar4 == (char *)0x0) break;
        iVar3 = ((int)pcVar4 - ((int)pvVar1 + ((int)resp->iov_len - buf._4_4_))) + 1;
        buf._4_4_ = buf._4_4_ - iVar3;
        proto_local = (application_protocol *)((long)&proto_local->type + (long)iVar3);
        res.bytes = res.bytes + 1;
      }
    }
  }
  bVar2.reqs = res.bytes;
  bVar2.bytes = (uint64_t)proto_local;
  return bVar2;
}

Assistant:

static struct byte_req_pair
memcache_ascii_consume_response(struct application_protocol *proto,
								struct iovec *resp)
{
	struct byte_req_pair res;
	int bytes_to_process, get_rep_size;
	char *buf, *ptr;

	res.bytes = 0;
	res.reqs = 0;
	bytes_to_process = resp->iov_len;
	buf = resp->iov_base;

	while (bytes_to_process) {
		if (bytes_to_process < 5) // minimum reply is EDN\r\n
			goto OUT;
		if (strncmp(&buf[resp->iov_len - bytes_to_process], "END\r\n", 5) ==
			0) {
			// key not found
			res.bytes += 5;
			res.reqs += 1;
			bytes_to_process -= 5;
			continue;
		}
		if (bytes_to_process < 8) // try STORED\r\n
			goto OUT;
		if (strncmp(&buf[resp->iov_len - bytes_to_process], "STORED\r\n", 8) ==
			0) {
			// successful set
			res.bytes += 8;
			res.reqs += 1;
			bytes_to_process -= 8;
			continue;
		}
		// try for get reply - look for 3 \n
		ptr = strchnth(&buf[resp->iov_len - bytes_to_process], '\n', 3);
		if (!ptr)
			goto OUT;
		get_rep_size = ptr - &buf[resp->iov_len - bytes_to_process] + 1;
		bytes_to_process -= get_rep_size;
		res.bytes += get_rep_size;
		res.reqs += 1;
	}

OUT:
	return res;
}